

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_utils.cpp
# Opt level: O0

void libtorrent::aux::delete_files
               (file_storage *fs,string *save_path,string *part_file_name,remove_flags_t options,
               storage_error *ec)

{
  bool bVar1;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> rhs;
  reference p_00;
  char *in_R9;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  string_view lhs;
  string_view lhs_00;
  string_view lhs_01;
  string_view rhs_00;
  string_view rhs_01;
  string_view rhs_02;
  bool local_2f1;
  bool local_2d9;
  byte local_2a2;
  file_index_t local_27c;
  error_condition local_278;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  string local_248;
  undefined1 local_228 [8];
  error_code error_1;
  bitfield_flag local_210;
  uchar local_20f;
  uchar local_20e;
  bitfield_flag local_20d;
  file_index_t local_20c;
  undefined1 local_208 [8];
  error_code error;
  reverse_iterator end;
  reverse_iterator i_1;
  string local_1e0;
  _Base_ptr local_1c0;
  undefined1 local_1b8;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  string local_190;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  local_170;
  undefined1 local_160 [8];
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  ret;
  string bp;
  undefined1 local_110 [8];
  string p;
  undefined1 local_e8 [6];
  bool complete;
  file_index_t local_c4;
  undefined1 local_c0 [8];
  string fp;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> i;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end3;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_7c;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  iStack_78;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __begin3;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  storage_error *ec_local;
  string *part_file_name_local;
  string *save_path_local;
  file_storage *fs_local;
  remove_flags_t options_local;
  
  directories._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = '\x01';
  directories._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = options.m_val;
  directories._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
       libtorrent::flags::operator&
                 (options.m_val,
                  (bitfield_flag<unsigned_char,_libtorrent::remove_flags_tag,_void>)'\x01');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                    ((bitfield_flag *)
                     ((long)&directories._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  if (bVar1) {
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&__range3);
    iStack_78 = file_storage::file_range(fs);
    local_7c = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
               ::begin(&stack0xffffffffffffff88);
    rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
          ::end(&stack0xffffffffffffff88);
    while( true ) {
      bVar1 = libtorrent::operator!=(local_7c,rhs);
      if (!bVar1) break;
      local_c4.m_val =
           (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                ::operator*(&local_7c);
      fp.field_2._12_4_ = local_c4.m_val;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e8,"",(allocator<char> *)(p.field_2._M_local_buf + 0xf));
      file_storage::file_path((string *)local_c0,fs,local_c4,(string *)local_e8);
      ::std::__cxx11::string::~string((string *)local_e8);
      ::std::allocator<char>::~allocator((allocator<char> *)(p.field_2._M_local_buf + 0xf));
      p.field_2._8_4_ = fp.field_2._12_4_;
      p.field_2._M_local_buf[0xe] =
           file_storage::file_absolute_path(fs,(file_index_t)fp.field_2._12_4_);
      if ((bool)p.field_2._M_local_buf[0xe]) {
        ::std::__cxx11::string::string((string *)local_110,(string *)local_c0);
      }
      else {
        auVar3 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)save_path);
        lhs._M_len = auVar3._8_8_;
        auVar2 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_c0);
        lhs._M_str = auVar2._0_8_;
        rhs_00._M_str = in_R9;
        rhs_00._M_len = auVar2._8_8_;
        combine_path_abi_cxx11_((string *)local_110,auVar3._0_8_,lhs,rhs_00);
      }
      if ((p.field_2._M_local_buf[0xe] & 1U) == 0) {
        parent_path((string *)&ret.second,(string *)local_c0);
        ::std::
        pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
        ::
        pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_true>
                  ((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                    *)local_160);
        ret.first._M_node._0_1_ = 1;
        while( true ) {
          local_2a2 = 0;
          if (((byte)ret.first._M_node & 1) != 0) {
            local_2a2 = ::std::__cxx11::string::empty();
            local_2a2 = local_2a2 ^ 0xff;
          }
          if ((local_2a2 & 1) == 0) break;
          auVar3 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)save_path);
          local_1a0 = auVar3;
          auVar3 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&ret.second)
          ;
          lhs_00._M_str = auVar3._0_8_;
          lhs_00._M_len = local_1a0._8_8_;
          rhs_01._M_str = in_R9;
          rhs_01._M_len = auVar3._8_8_;
          local_1b0 = auVar3;
          combine_path_abi_cxx11_(&local_190,(libtorrent *)local_1a0._0_8_,lhs_00,rhs_01);
          pVar4 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range3,&local_190);
          local_1c0 = (_Base_ptr)pVar4.first._M_node;
          local_1b8 = pVar4.second;
          local_170.first._M_node = local_1c0;
          local_170.second = (bool)local_1b8;
          ::std::
          pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
          ::operator=((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                       *)local_160,&local_170);
          ::std::__cxx11::string::~string((string *)&local_190);
          parent_path(&local_1e0,(string *)&ret.second);
          ::std::__cxx11::string::operator=((string *)&ret.second,(string *)&local_1e0);
          ::std::__cxx11::string::~string((string *)&local_1e0);
        }
        ::std::__cxx11::string::~string((string *)&ret.second);
      }
      anon_unknown_24::delete_one_file((string *)local_110,&ec->ec);
      bVar1 = storage_error::operator_cast_to_bool(ec);
      if (bVar1) {
        storage_error::file(ec,(file_index_t)fp.field_2._12_4_);
        ec->operation = file_remove;
      }
      ::std::__cxx11::string::~string((string *)local_110);
      ::std::__cxx11::string::~string((string *)local_c0);
      index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
      operator++(&local_7c);
    }
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::rbegin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&end);
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::rend((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&error.cat_);
    while( true ) {
      bVar1 = ::std::operator!=(&end,(reverse_iterator<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&error.cat_);
      if (!bVar1) break;
      boost::system::error_code::error_code((error_code *)local_208);
      p_00 = ::std::
             reverse_iterator<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&end);
      anon_unknown_24::delete_one_file(p_00,(error_code *)local_208);
      bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_208);
      if (bVar1) {
        bVar1 = storage_error::operator_cast_to_bool(ec);
        if (!bVar1) {
          strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::strong_typedef(&local_20c,-1);
          storage_error::file(ec,local_20c);
          (ec->ec).val_ = local_208._0_4_;
          (ec->ec).failed_ = (bool)local_208[4];
          *(undefined3 *)&(ec->ec).field_0x5 = local_208._5_3_;
          (ec->ec).cat_ = (error_category *)error._0_8_;
          ec->operation = file_remove;
        }
      }
      ::std::
      reverse_iterator<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&end);
    }
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range3);
  }
  local_20f = '\x02';
  local_20e = options.m_val;
  local_20d = (bitfield_flag)
              libtorrent::flags::operator&
                        ((bitfield_flag<unsigned_char,_libtorrent::remove_flags_tag,_void>)
                         options.m_val,
                         (bitfield_flag<unsigned_char,_libtorrent::remove_flags_tag,_void>)'\x02');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_20d);
  local_2d9 = true;
  if (!bVar1) {
    error_1.cat_._6_1_ = '\x01';
    error_1.cat_._7_1_ = options.m_val;
    local_210 = (bitfield_flag)
                libtorrent::flags::operator&
                          ((bitfield_flag<unsigned_char,_libtorrent::remove_flags_tag,_void>)
                           options.m_val,
                           (bitfield_flag<unsigned_char,_libtorrent::remove_flags_tag,_void>)'\x01')
    ;
    local_2d9 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_210);
  }
  if (local_2d9 != false) {
    boost::system::error_code::error_code((error_code *)local_228);
    local_258 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)save_path);
    local_268 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)part_file_name)
    ;
    lhs_01._M_str = local_268._0_8_;
    lhs_01._M_len = local_258._8_8_;
    rhs_02._M_str = in_R9;
    rhs_02._M_len = local_268._8_8_;
    combine_path_abi_cxx11_(&local_248,(libtorrent *)local_258._0_8_,lhs_01,rhs_02);
    remove((libtorrent *)&local_248,(char *)local_228);
    ::std::__cxx11::string::~string((string *)&local_248);
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_228);
    local_2f1 = false;
    if (bVar1) {
      boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                (&local_278,no_such_file_or_directory,(type *)0x0);
      local_2f1 = boost::system::operator!=((error_code *)local_228,&local_278);
    }
    if (local_2f1 != false) {
      strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::strong_typedef(&local_27c,-1);
      storage_error::file(ec,local_27c);
      (ec->ec).val_ = local_228._0_4_;
      (ec->ec).failed_ = (bool)local_228[4];
      *(undefined3 *)&(ec->ec).field_0x5 = local_228._5_3_;
      (ec->ec).cat_ = (error_category *)error_1._0_8_;
      ec->operation = file_remove;
    }
  }
  return;
}

Assistant:

void delete_files(file_storage const& fs, std::string const& save_path
		, std::string const& part_file_name, remove_flags_t const options, storage_error& ec)
	{
		if (options & session::delete_files)
		{
			// delete the files from disk
			std::set<std::string> directories;
			using iter_t = std::set<std::string>::iterator;
			for (auto const i : fs.file_range())
			{
				std::string const fp = fs.file_path(i);
				bool const complete = fs.file_absolute_path(i);
				std::string const p = complete ? fp : combine_path(save_path, fp);
				if (!complete)
				{
					std::string bp = parent_path(fp);
					std::pair<iter_t, bool> ret;
					ret.second = true;
					while (ret.second && !bp.empty())
					{
						ret = directories.insert(combine_path(save_path, bp));
						bp = parent_path(bp);
					}
				}
				delete_one_file(p, ec.ec);
				if (ec) { ec.file(i); ec.operation = operation_t::file_remove; }
			}

			// remove the directories. Reverse order to delete
			// subdirectories first

			for (auto i = directories.rbegin()
				, end(directories.rend()); i != end; ++i)
			{
				error_code error;
				delete_one_file(*i, error);
				if (error && !ec)
				{
					ec.file(file_index_t(-1));
					ec.ec = error;
					ec.operation = operation_t::file_remove;
				}
			}
		}

		// when we're deleting "files", we also delete the part file
		if ((options & session::delete_partfile)
			|| (options & session::delete_files))
		{
			error_code error;
			remove(combine_path(save_path, part_file_name), error);
			if (error && error != boost::system::errc::no_such_file_or_directory)
			{
				ec.file(file_index_t(-1));
				ec.ec = error;
				ec.operation = operation_t::file_remove;
			}
		}
	}